

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

uint32_t __thiscall r_comp::Compiler::add_hlp_reference(Compiler *this,string *reference_name)

{
  pointer pbVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  pbVar1 = (this->hlp_references).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->hlp_references).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  bVar6 = lVar3 != 0;
  if (bVar6) {
    uVar4 = lVar3 >> 5;
    __n = reference_name->_M_string_length;
    uVar5 = 0;
    do {
      if ((__n == pbVar1[uVar5]._M_string_length) &&
         ((__n == 0 ||
          (iVar2 = bcmp((reference_name->_M_dataplus)._M_p,pbVar1[uVar5]._M_dataplus._M_p,__n),
          iVar2 == 0)))) {
        if (bVar6) {
          return (uint32_t)uVar5;
        }
        break;
      }
      uVar5 = (ulong)((uint32_t)uVar5 + 1);
      bVar6 = uVar5 < uVar4;
    } while (uVar5 < uVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->hlp_references,reference_name);
  return (int)((ulong)((long)(this->hlp_references).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->hlp_references).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
}

Assistant:

uint32_t Compiler::add_hlp_reference(std::string reference_name)
{
    for (uint32_t i = 0; i < hlp_references.size(); ++i)
        if (reference_name == hlp_references[i]) {
            return i;
        }

    hlp_references.push_back(reference_name);
    return hlp_references.size() - 1;
}